

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_tcp_nodelay(socket *so,int nodelay_on)

{
  int iVar1;
  int local_1c;
  socket *psStack_18;
  int nodelay_on_local;
  socket *so_local;
  
  if ((((so->lsa).sa.sa_family == 2) || ((so->lsa).sa.sa_family == 10)) &&
     (local_1c = nodelay_on, psStack_18 = so, iVar1 = setsockopt(so->sock,6,1,&local_1c,4),
     iVar1 != 0)) {
    so_local._4_4_ = 1;
  }
  else {
    so_local._4_4_ = 0;
  }
  return so_local._4_4_;
}

Assistant:

static int
set_tcp_nodelay(const struct socket *so, int nodelay_on)
{
	if ((so->lsa.sa.sa_family == AF_INET)
	    || (so->lsa.sa.sa_family == AF_INET6)) {
		/* Only for TCP sockets */
		if (setsockopt(so->sock,
		               IPPROTO_TCP,
		               TCP_NODELAY,
		               (SOCK_OPT_TYPE)&nodelay_on,
		               sizeof(nodelay_on))
		    != 0) {
			/* Error */
			return 1;
		}
	}
	/* OK */
	return 0;
}